

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_&>
::streamReconstructedExpression
          (BinaryExpr<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_RDX;
  duration<long,_std::ratio<1L,_1000000000L>_> *duration;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  StringMaker<std::chrono::duration<long,std::ratio<1l,1000000000l>>,void>::convert_abi_cxx11_
            (&local_40,
             (StringMaker<std::chrono::duration<long,std::ratio<1l,1000000000l>>,void> *)this->m_lhs
             ,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<std::chrono::duration<long,std::ratio<1l,1000000000l>>,void>::convert_abi_cxx11_
            (&local_60,
             (StringMaker<std::chrono::duration<long,std::ratio<1l,1000000000l>>,void> *)this->m_rhs
             ,duration);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }